

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Dial.cxx
# Opt level: O3

void __thiscall Fl_Dial::draw(Fl_Dial *this,int X,int Y,int W,int H)

{
  uchar uVar1;
  _func_int **pp_Var2;
  bool bVar3;
  int iVar4;
  Fl_Color FVar5;
  ulong uVar6;
  ulong uVar7;
  Fl_Boxtype t;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  double dVar12;
  
  if ((char)(this->super_Fl_Valuator).super_Fl_Widget.damage_ < '\0') {
    Fl_Widget::draw_box((Fl_Widget *)this,(uint)(this->super_Fl_Valuator).super_Fl_Widget.box_,X,Y,W
                        ,H,(this->super_Fl_Valuator).super_Fl_Widget.color_);
  }
  iVar4 = Fl::box_dx((uint)(this->super_Fl_Valuator).super_Fl_Widget.box_);
  uVar9 = iVar4 + X;
  iVar4 = Fl::box_dy((uint)(this->super_Fl_Valuator).super_Fl_Widget.box_);
  uVar8 = iVar4 + Y;
  iVar4 = Fl::box_dw((uint)(this->super_Fl_Valuator).super_Fl_Widget.box_);
  uVar11 = W - iVar4;
  iVar4 = Fl::box_dh((uint)(this->super_Fl_Valuator).super_Fl_Widget.box_);
  uVar10 = H - iVar4;
  iVar4 = (int)*(short *)&(this->super_Fl_Valuator).field_0xa4;
  dVar12 = (this->super_Fl_Valuator).min;
  dVar12 = (double)iVar4 +
           (((this->super_Fl_Valuator).value_ - dVar12) *
           (double)(*(short *)&(this->super_Fl_Valuator).field_0xa6 - iVar4)) /
           ((this->super_Fl_Valuator).max - dVar12);
  if ((this->super_Fl_Valuator).super_Fl_Widget.type_ != '\x02') {
    if (-1 < (char)(this->super_Fl_Valuator).super_Fl_Widget.damage_) {
      iVar4 = Fl_Widget::active_r((Fl_Widget *)this);
      FVar5 = (this->super_Fl_Valuator).super_Fl_Widget.color_;
      if (iVar4 == 0) {
        FVar5 = fl_inactive(FVar5);
      }
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                (fl_graphics_driver,(ulong)FVar5);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21])
                (0,fl_graphics_driver,(ulong)(uVar9 + 1),(ulong)(uVar8 + 1),(ulong)(uVar11 - 2),
                 (ulong)(uVar10 - 2));
    }
    Fl_Graphics_Driver::push_matrix(fl_graphics_driver);
    Fl_Graphics_Driver::mult_matrix
              (fl_graphics_driver,1.0,0.0,0.0,1.0,(double)(int)((int)uVar11 / 2 + uVar9) + -0.5,
               (double)(int)((int)uVar10 / 2 + uVar8) + -0.5);
    Fl_Graphics_Driver::mult_matrix
              (fl_graphics_driver,(double)(int)(uVar11 - 1),0.0,0.0,(double)(int)(uVar10 - 1),0.0,
               0.0);
    Fl_Graphics_Driver::rotate(fl_graphics_driver,45.0 - dVar12);
    iVar4 = Fl_Widget::active_r((Fl_Widget *)this);
    FVar5 = (this->super_Fl_Valuator).super_Fl_Widget.color2_;
    if (iVar4 == 0) {
      FVar5 = fl_inactive(FVar5);
    }
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar5);
    uVar1 = (this->super_Fl_Valuator).super_Fl_Widget.type_;
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1b])();
    pp_Var2 = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device;
    if (uVar1 == '\0') {
      (*pp_Var2[0x1e])(0xbfc999999999999a,0x3fc999999999999a,0x3fb1eb851eb851ec);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x25])();
      iVar4 = Fl_Widget::active_r((Fl_Widget *)this);
      uVar6 = 0;
      if (iVar4 == 0) {
        FVar5 = fl_inactive(0);
        uVar6 = (ulong)FVar5;
      }
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,uVar6);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1a])();
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1e])
                (0xbfc999999999999a,0x3fc999999999999a,0x3fb1eb851eb851ec);
    }
    else {
      (*pp_Var2[0x1c])(0,0);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])(0xbfa47ae147ae147b,0);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
                (0xbfd0000000000000,0x3fd0000000000000);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])(0,0x3fa47ae147ae147b);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x25])();
      iVar4 = Fl_Widget::active_r((Fl_Widget *)this);
      uVar6 = 0;
      if (iVar4 == 0) {
        FVar5 = fl_inactive(0);
        uVar6 = (ulong)FVar5;
      }
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,uVar6);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1a])();
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])(0,0);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])(0xbfa47ae147ae147b,0);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
                (0xbfd0000000000000,0x3fd0000000000000);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])(0,0x3fa47ae147ae147b);
    }
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x24])();
    Fl_Graphics_Driver::pop_matrix(fl_graphics_driver);
    return;
  }
  t = (Fl_Boxtype)(this->super_Fl_Valuator).super_Fl_Widget.box_;
  if (_FL_ROUND_UP_BOX < t) {
    iVar4 = Fl::box_dx(t);
    if (iVar4 != 0) {
      uVar9 = uVar9 - 1;
      uVar8 = uVar8 - 1;
      uVar11 = uVar11 + 2;
      uVar10 = uVar10 + 2;
      bVar3 = true;
      goto LAB_001abc67;
    }
  }
  bVar3 = false;
LAB_001abc67:
  uVar6 = (ulong)uVar8;
  iVar4 = Fl_Widget::active_r((Fl_Widget *)this);
  FVar5 = (this->super_Fl_Valuator).super_Fl_Widget.color_;
  if (iVar4 == 0) {
    FVar5 = fl_inactive(FVar5);
  }
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar5);
  iVar4 = (int)*(short *)&(this->super_Fl_Valuator).field_0xa4;
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21])
            ((double)(0x10e - iVar4),
             *(double *)(&DAT_0021b928 + (ulong)((double)iVar4 < dVar12) * 8) - dVar12,
             fl_graphics_driver,(ulong)uVar9,uVar6,(ulong)uVar11,(ulong)uVar10);
  iVar4 = Fl_Widget::active_r((Fl_Widget *)this);
  FVar5 = (this->super_Fl_Valuator).super_Fl_Widget.color2_;
  if (iVar4 == 0) {
    FVar5 = fl_inactive(FVar5);
  }
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar5);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21])
            (270.0 - dVar12,(double)(0x10e - *(short *)&(this->super_Fl_Valuator).field_0xa4),
             fl_graphics_driver,(ulong)uVar9,uVar6,(ulong)uVar11,(ulong)uVar10);
  if (bVar3) {
    iVar4 = Fl_Widget::active_r((Fl_Widget *)this);
    uVar7 = 0;
    if (iVar4 == 0) {
      FVar5 = fl_inactive(0);
      uVar7 = (ulong)FVar5;
    }
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,uVar7);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x20])
              (0,0x4076800000000000,fl_graphics_driver,(ulong)uVar9,uVar6,(ulong)uVar11,
               (ulong)uVar10);
    return;
  }
  return;
}

Assistant:

void Fl_Dial::draw(int X, int Y, int W, int H) {
  if (damage()&FL_DAMAGE_ALL) draw_box(box(), X, Y, W, H, color());
  X += Fl::box_dx(box());
  Y += Fl::box_dy(box());
  W -= Fl::box_dw(box());
  H -= Fl::box_dh(box());
  double angle = (a2-a1)*(value()-minimum())/(maximum()-minimum()) + a1;
  if (type() == FL_FILL_DIAL) {
    // foo: draw this nicely in certain round box types
    int foo = (box() > _FL_ROUND_UP_BOX && Fl::box_dx(box()));
    if (foo) {X--; Y--; W+=2; H+=2;}
    if (active_r()) fl_color(color());
    else fl_color(fl_inactive(color()));
    fl_pie(X, Y, W, H, 270-a1, angle > a1 ? 360+270-angle : 270-360-angle);
    if (active_r()) fl_color(selection_color());
    else fl_color(fl_inactive(selection_color()));
    fl_pie(X, Y, W, H, 270-angle, 270-a1);
    if (foo) {
      if (active_r()) fl_color(FL_FOREGROUND_COLOR);
      else fl_color(fl_inactive(FL_FOREGROUND_COLOR));
      fl_arc(X, Y, W, H, 0, 360);
    }
    return;
  }
  if (!(damage()&FL_DAMAGE_ALL)) {
    if (active_r()) fl_color(color());
    else fl_color(fl_inactive(color()));
    fl_pie(X+1, Y+1, W-2, H-2, 0, 360);
  }
  fl_push_matrix();
  fl_translate(X+W/2-.5, Y+H/2-.5);
  fl_scale(W-1, H-1);
  fl_rotate(45-angle);
  if (active_r()) fl_color(selection_color());
  else fl_color(fl_inactive(selection_color()));
  if (type()) { // FL_LINE_DIAL
    fl_begin_polygon();
    fl_vertex(0.0,   0.0);
    fl_vertex(-0.04, 0.0);
    fl_vertex(-0.25, 0.25);
    fl_vertex(0.0,   0.04);
    fl_end_polygon();
    if (active_r()) fl_color(FL_FOREGROUND_COLOR);
    else fl_color(fl_inactive(FL_FOREGROUND_COLOR));
    fl_begin_loop();
    fl_vertex(0.0,   0.0);
    fl_vertex(-0.04, 0.0);
    fl_vertex(-0.25, 0.25);
    fl_vertex(0.0,   0.04);
    fl_end_loop();
  } else {
    fl_begin_polygon(); fl_circle(-0.20, 0.20, 0.07); fl_end_polygon();
    if (active_r()) fl_color(FL_FOREGROUND_COLOR);
    else fl_color(fl_inactive(FL_FOREGROUND_COLOR));
    fl_begin_loop(); fl_circle(-0.20, 0.20, 0.07); fl_end_loop();
  }
  fl_pop_matrix();
}